

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iostl.c
# Opt level: O3

void trico_remove_duplicate_vertices
               (uint32_t *nr_of_vertices,float **vertices,uint32_t nr_of_triangles,
               uint32_t **triangles)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t *puVar3;
  float *pfVar4;
  float fVar5;
  float *L;
  ulong uVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  uint32_t uVar10;
  float *pfVar11;
  float *pfVar12;
  bool bVar13;
  
  if (nr_of_triangles == 0) {
    return;
  }
  L = (float *)malloc((ulong)(nr_of_triangles * 3) << 4);
  puVar3 = *triangles;
  pfVar4 = *vertices;
  uVar6 = 0;
  pfVar7 = L;
  do {
    fVar5 = (float)uVar6;
    uVar10 = puVar3[uVar6 & 0xffffffff];
    uVar1 = puVar3[(uint)((int)fVar5 + 1)];
    uVar2 = puVar3[(uint)((int)fVar5 + 2)];
    *pfVar7 = pfVar4[uVar10 * 3];
    pfVar7[1] = pfVar4[uVar10 * 3 + 1];
    pfVar7[2] = pfVar4[uVar10 * 3 + 2];
    pfVar7[3] = fVar5;
    pfVar7[4] = pfVar4[uVar1 * 3];
    pfVar7[5] = pfVar4[uVar1 * 3 + 1];
    pfVar7[6] = pfVar4[uVar1 * 3 + 2];
    pfVar7[7] = (float)((int)fVar5 + 1);
    pfVar7[8] = pfVar4[uVar2 * 3];
    pfVar7[9] = pfVar4[uVar2 * 3 + 1];
    pfVar7[10] = pfVar4[uVar2 * 3 + 2];
    pfVar7[0xb] = (float)((int)fVar5 + 2);
    pfVar7 = pfVar7 + 0xc;
    uVar6 = uVar6 + 3;
  } while ((ulong)nr_of_triangles * 3 != uVar6);
  trico_quicksort_vertices(L,0,(ulong)(nr_of_triangles * 3 - 1));
  *nr_of_vertices = 0;
  *pfVar4 = *L;
  pfVar4[1] = L[1];
  pfVar4[2] = L[2];
  puVar3[(uint)L[3]] = 0;
  if (nr_of_triangles * 0xc != 4) {
    pfVar8 = L;
    pfVar7 = L;
    pfVar12 = L + 4;
    do {
      pfVar11 = pfVar12;
      if ((((*pfVar7 != pfVar8[4]) || (NAN(*pfVar7) || NAN(pfVar8[4]))) || (pfVar7[1] != pfVar8[5]))
         || (NAN(pfVar7[1]) || NAN(pfVar8[5]))) {
LAB_00113c33:
        pfVar12 = pfVar7 + 4;
        bVar13 = pfVar7 != pfVar8;
        pfVar9 = pfVar7;
        pfVar7 = pfVar12;
        if (bVar13) {
          uVar10 = *nr_of_vertices;
          do {
            puVar3[(uint)pfVar12[3]] = uVar10;
            pfVar7 = pfVar12 + 4;
            bVar13 = pfVar12 != pfVar8;
            pfVar9 = pfVar8;
            pfVar12 = pfVar7;
          } while (bVar13);
        }
        uVar10 = *nr_of_vertices + 1;
        *nr_of_vertices = uVar10;
        pfVar4[uVar10 * 3] = *pfVar7;
        pfVar4[uVar10 * 3 + 1] = pfVar9[5];
        pfVar4[uVar10 * 3 + 2] = pfVar9[6];
        puVar3[(uint)pfVar9[7]] = uVar10;
      }
      else if ((pfVar7[2] != pfVar8[6]) || (NAN(pfVar7[2]) || NAN(pfVar8[6]))) goto LAB_00113c33;
      pfVar8 = pfVar11;
      pfVar12 = pfVar11 + 4;
    } while (pfVar11 + 4 != L + nr_of_triangles * 0xc);
    if (pfVar7 != pfVar11) {
      uVar10 = *nr_of_vertices;
      do {
        pfVar4 = pfVar7 + 7;
        pfVar7 = pfVar7 + 4;
        puVar3[(uint)*pfVar4] = uVar10;
      } while (pfVar7 != pfVar11);
    }
  }
  *nr_of_vertices = *nr_of_vertices + 1;
  free(L);
  return;
}

Assistant:

static void trico_remove_duplicate_vertices(uint32_t* nr_of_vertices, float** vertices, uint32_t nr_of_triangles, uint32_t** triangles)
  {
  if (nr_of_triangles == 0)
    return;

  float* vert = (float*)trico_malloc(nr_of_triangles * 3 * sizeof(float) * 4);

  float* p_vert = vert;
  for (uint32_t i = 0; i < nr_of_triangles; ++i)
    {
    const uint32_t id0 = i * 3;
    const uint32_t id1 = id0 + 1;
    const uint32_t id2 = id1 + 1;
    const uint32_t v0 = (*triangles)[id0];
    const uint32_t v1 = (*triangles)[id1];
    const uint32_t v2 = (*triangles)[id2];


    *p_vert++ = (*vertices)[v0 * 3];
    *p_vert++ = (*vertices)[v0 * 3 + 1];
    *p_vert++ = (*vertices)[v0 * 3 + 2];
    *p_vert++ = *(const float*)(&id0);

    *p_vert++ = (*vertices)[v1 * 3];
    *p_vert++ = (*vertices)[v1 * 3 + 1];
    *p_vert++ = (*vertices)[v1 * 3 + 2];
    *p_vert++ = *(const float*)(&id1);

    *p_vert++ = (*vertices)[v2 * 3];
    *p_vert++ = (*vertices)[v2 * 3 + 1];
    *p_vert++ = (*vertices)[v2 * 3 + 2];
    *p_vert++ = *(const float*)(&id2);
    }

  trico_quicksort_vertices(vert, 0, (3 * nr_of_triangles) - 1);

  float* first = vert;
  float* last = vert + 3 * nr_of_triangles * 4;

  *nr_of_vertices = 0;

  float* result = first;
  (*vertices)[*nr_of_vertices * 3] = result[0];
  (*vertices)[*nr_of_vertices * 3 + 1] = result[1];
  (*vertices)[*nr_of_vertices * 3 + 2] = result[2];
  (*triangles)[*(uint32_t*)(&(result[3]))] = *nr_of_vertices;
  while ((first += 4) != last)
    {
    if (trico_equal_vertices(result, first) == 0)
      {
      while ((result += 4) != first)
        {
        (*triangles)[*(uint32_t*)(&(result[3]))] = *nr_of_vertices;
        }
      ++(*nr_of_vertices);
      (*vertices)[*nr_of_vertices * 3] = result[0];
      (*vertices)[*nr_of_vertices * 3 + 1] = result[1];
      (*vertices)[*nr_of_vertices * 3 + 2] = result[2];
      (*triangles)[*(uint32_t*)(&(result[3]))] = *nr_of_vertices;
      }
    }
  while ((result += 4) != first)
    {
    (*triangles)[*(uint32_t*)(&(result[3]))] = *nr_of_vertices;
    }
  ++(*nr_of_vertices);

  trico_free(vert);
  }